

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

int tagsvisit(int f,int n)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  FILE *__stream;
  ctag *elm;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ctag *pcVar7;
  int *piVar8;
  char local_4c8 [8];
  char fname [1024];
  uint local_b0;
  
  iVar1 = getbufcwd(local_4c8,0x400);
  if (iVar1 == 0) {
    local_4c8[0] = '\0';
  }
  uVar2 = strlcat(local_4c8,"tags",0x400);
  if (uVar2 < 0x400) {
    pcVar3 = eread("Visit tags table (default %s): ",local_4c8,0x400,0x3c,"tags");
    if (pcVar3 == (char *)0x0) {
      iVar1 = 2;
    }
    else {
      if ((tags.rbh_root != (ctag *)0x0) &&
         (iVar1 = eyorn("Keep current list of tags table also"), iVar1 == 0)) {
        ewprintf("Starting a new list of tags table");
        unloadtags();
      }
      if (*pcVar3 == '\0') {
        pcVar3 = local_4c8;
      }
      __stream = fopen(pcVar3,"r");
      if (__stream == (FILE *)0x0) {
        dobeep();
        iVar1 = 0;
        ewprintf("Unable to open tags file: %s",pcVar3);
      }
      else {
        iVar1 = fileno(__stream);
        iVar1 = fstat(iVar1,(stat *)(fname + 0x3f8));
        if (iVar1 == -1) {
          dobeep();
          piVar8 = __errno_location();
          pcVar3 = strerror(*piVar8);
          ewprintf("fstat: %s",pcVar3);
        }
        else {
          if ((local_b0 & 0xf000) == 0x8000) {
            while( true ) {
              pcVar3 = (char *)fparseln(__stream,0,0,"\\\\",10);
              if (pcVar3 == (char *)0x0) {
                fclose(__stream);
                return 1;
              }
              elm = (ctag *)malloc(0x38);
              if (elm == (ctag *)0x0) break;
              elm->tag = pcVar3;
              pcVar4 = strchr(pcVar3,9);
              if (pcVar4 == (char *)0x0) goto LAB_0011e837;
              *pcVar4 = '\0';
              elm->fname = pcVar4 + 1;
              pcVar4 = strchr(pcVar4 + 1,9);
              if ((pcVar4 == (char *)0x0) || (*pcVar4 = '\0', pcVar4[1] == '\0')) goto LAB_0011e837;
              pcVar5 = strstr(pcVar4 + 1,";\"");
              if (pcVar5 != (char *)0x0) {
                *pcVar5 = '\0';
              }
              sVar6 = strlen(pcVar4 + 1);
              pcVar4[sVar6] = '\0';
              if (pcVar4[sVar6 - 1] == '$') {
                pcVar4[sVar6 - 1] = '\0';
              }
              pcVar5 = pcVar4 + 3;
              if (pcVar4[2] != '^') {
                pcVar5 = pcVar4 + 2;
              }
              elm->pat = pcVar5;
              pcVar7 = tagtree_RB_INSERT(&tags,elm);
              if (pcVar7 != (ctag *)0x0) {
                free(elm);
                free(pcVar3);
              }
            }
            dobeep();
            ewprintf("Out of memory");
LAB_0011e837:
            free(elm);
            free(pcVar3);
            fclose(__stream);
            return 0;
          }
          dobeep();
          ewprintf("Not a regular file");
        }
        iVar1 = 0;
        fclose(__stream);
      }
    }
  }
  else {
    dobeep();
    iVar1 = 0;
    ewprintf("Filename too long");
  }
  return iVar1;
}

Assistant:

int
tagsvisit(int f, int n)
{
	char fname[NFILEN], *bufp, *temp;

	if (getbufcwd(fname, sizeof(fname)) == FALSE)
		fname[0] = '\0';

	if (strlcat(fname, DEFAULTFN, sizeof(fname)) >= sizeof(fname)) {
		dobeep();
		ewprintf("Filename too long");
		return (FALSE);
	}

	bufp = eread("Visit tags table (default %s): ", fname,
	    NFILEN, EFFILE | EFCR | EFNEW | EFDEF, DEFAULTFN);
	if (bufp == NULL)
		return (ABORT);

	if (!RB_EMPTY(&tags)) {
		if (eyorn("Keep current list of tags table also") == FALSE) {
			ewprintf("Starting a new list of tags table");
			unloadtags();
		}
	}

	temp = bufp;
	if (temp[0] == '\0')
		temp = fname;

	return (loadtags(temp));
}